

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7_arr_func_3.cpp
# Opt level: O3

int fill_array(double *ar,int limit)

{
  ulong uVar1;
  int iVar2;
  double in_RAX;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  double temp;
  
  if (limit < 1) {
    uVar5 = 0;
  }
  else {
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter value # ",0xe)
      ;
      uVar1 = uVar4 + 1;
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
      std::istream::_M_extract<double>((double *)&std::cin);
      uVar5 = uVar4;
      if (((byte)cos[*(long *)(std::cin + -0x18)] & 5) != 0) {
        std::ios::clear((int)*(long *)(std::cin + -0x18) + 0x136428);
        do {
          iVar2 = std::istream::get();
        } while (iVar2 != 10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Bad input; input process terminated.\n",0x25);
        break;
      }
    } while ((0.0 <= in_RAX) &&
            (ar[uVar4] = in_RAX, uVar5 = (ulong)(uint)limit, uVar4 = uVar1, (uint)limit != uVar1));
  }
  return (int)uVar5;
}

Assistant:

int fill_array (double ar[], int limit)
{
    using namespace std;
    double temp;
    int i;
    for (i = 0; i < limit; i++)
    {
        cout << "Enter value # " << (i + 1) << ":";
        cin >> temp;
        if (!cin) {
            cin.clear();
            //  if \n, just skip
            while(cin.get() != '\n')
            {
                continue;
            }
            cout << "Bad input; input process terminated.\n";
            break;
        }
        else if (temp < 0)
        {
            // if value is less than 0
            break;
        }
        //  write into array
        ar[i] = temp;
    }

    //  return the actual input numbers
    return i;
}